

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.c
# Opt level: O2

void destroy_reporter(TestReporter *reporter)

{
  destroy_breadcrumb(reporter->breadcrumb);
  free(reporter->memo);
  free(reporter);
  if (context.reporter == reporter) {
    context.reporter = (TestReporter *)0x0;
  }
  return;
}

Assistant:

void destroy_reporter(TestReporter *reporter) {
    destroy_breadcrumb((CgreenBreadcrumb *)reporter->breadcrumb);
    destroy_memo((TestReportMemo *)reporter->memo);
    free(reporter);
    // hack to allow destroy_reporter to be called in reporter_tests when
    // tests are running in same process
    if (context.reporter == reporter)
    {
        context.reporter = NULL;
    }
}